

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int simpleOpen(sqlite3_tokenizer *pTokenizer,char *pInput,int nBytes,
              sqlite3_tokenizer_cursor **ppCursor)

{
  int iVar1;
  sqlite3_tokenizer_cursor *psVar2;
  int iVar4;
  size_t sVar3;
  
  psVar2 = (sqlite3_tokenizer_cursor *)sqlite3_malloc(0x30);
  if (psVar2 == (sqlite3_tokenizer_cursor *)0x0) {
    iVar4 = 7;
  }
  else {
    psVar2[1].pTokenizer = (sqlite3_tokenizer *)pInput;
    iVar4 = 0;
    iVar1 = 0;
    if ((pInput != (char *)0x0) && (iVar1 = nBytes, nBytes < 0)) {
      sVar3 = strlen(pInput);
      iVar1 = (int)sVar3;
    }
    *(int *)&psVar2[2].pTokenizer = iVar1;
    *(undefined8 *)((long)&psVar2[2].pTokenizer + 4) = 0;
    psVar2[4].pTokenizer = (sqlite3_tokenizer *)0x0;
    *(undefined4 *)&psVar2[5].pTokenizer = 0;
    *ppCursor = psVar2;
  }
  return iVar4;
}

Assistant:

static int simpleOpen(
  sqlite3_tokenizer *pTokenizer,         /* The tokenizer */
  const char *pInput, int nBytes,        /* String to be tokenized */
  sqlite3_tokenizer_cursor **ppCursor    /* OUT: Tokenization cursor */
){
  simple_tokenizer_cursor *c;

  UNUSED_PARAMETER(pTokenizer);

  c = (simple_tokenizer_cursor *) sqlite3_malloc(sizeof(*c));
  if( c==NULL ) return SQLITE_NOMEM;

  c->pInput = pInput;
  if( pInput==0 ){
    c->nBytes = 0;
  }else if( nBytes<0 ){
    c->nBytes = (int)strlen(pInput);
  }else{
    c->nBytes = nBytes;
  }
  c->iOffset = 0;                 /* start tokenizing at the beginning */
  c->iToken = 0;
  c->pToken = NULL;               /* no space allocated, yet. */
  c->nTokenAllocated = 0;

  *ppCursor = &c->base;
  return SQLITE_OK;
}